

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

wchar_t history_save_fp(HistoryW *h,size_t nelem,FILE *fp)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  long lVar4;
  char *mbdst;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  ulong __size;
  HistEventW ev;
  HistEventW local_48;
  FILE *local_38;
  
  lVar4 = ftell((FILE *)fp);
  if (((lVar4 == 0) && (iVar1 = fputs("_HiStOrY_V2_\n",(FILE *)fp), iVar1 == -1)) ||
     (mbdst = (char *)malloc(0x400), mbdst == (char *)0x0)) {
    wVar2 = L'\xffffffff';
  }
  else {
    if ((nelem != 0xffffffffffffffff) &&
       (wVar2 = (*h->h_first)(h->h_ref,&local_48), wVar2 != L'\xffffffff')) {
      lVar4 = nelem + 1;
      do {
        lVar4 = lVar4 + -1;
        if (lVar4 == 0) goto LAB_0010b1e1;
        wVar2 = (*h->h_next)(h->h_ref,&local_48);
      } while (wVar2 != L'\xffffffff');
    }
    wVar2 = (*h->h_last)(h->h_ref,&local_48);
    if (wVar2 == L'\xffffffff') {
      wVar2 = L'\0';
    }
    else {
LAB_0010b1e1:
      __size = 0x400;
      wVar2 = L'\0';
      local_38 = (FILE *)fp;
      do {
        __s = ct_encode_string(local_48.str,&history_save_fp::conv);
        sVar5 = strlen(__s);
        pcVar6 = mbdst;
        if (__size <= sVar5 * 4) {
          __size = sVar5 * 4 + 0x401 & 0xfffffffffffffc00;
          pcVar6 = (char *)realloc(mbdst,__size);
          if (pcVar6 == (char *)0x0) {
            wVar2 = L'\xffffffff';
            break;
          }
        }
        mbdst = pcVar6;
        strvis(mbdst,__s,L'\x1c');
        fprintf(local_38,"%s\n",mbdst);
        wVar3 = (*h->h_prev)(h->h_ref,&local_48);
        wVar2 = wVar2 + L'\x01';
      } while (wVar3 != L'\xffffffff');
    }
    free(mbdst);
  }
  return wVar2;
}

Assistant:

static int
history_save_fp(TYPE(History) *h, size_t nelem, FILE *fp)
{
	TYPE(HistEvent) ev;
	int i = -1, retval;
	size_t len, max_size;
	char *ptr;
	const char *str;
#ifndef NARROWCHAR
	static ct_buffer_t conv;
#endif

	if (ftell(fp) == 0 && fputs(hist_cookie, fp) == EOF)
		goto done;
	ptr = h_malloc((max_size = 1024) * sizeof(*ptr));
	if (ptr == NULL)
		goto done;
	if (nelem != (size_t)-1) {
		for (retval = HFIRST(h, &ev); retval != -1 && nelem-- > 0;
		    retval = HNEXT(h, &ev))
			continue;
	} else
		retval = -1;

	if (retval == -1)
		retval = HLAST(h, &ev);

	for (i = 0; retval != -1; retval = HPREV(h, &ev), i++) {
		str = ct_encode_string(ev.str, &conv);
		len = strlen(str) * 4 + 1;
		if (len > max_size) {
			char *nptr;
			max_size = (len + 1024) & (size_t)~1023;
			nptr = h_realloc(ptr, max_size * sizeof(*ptr));
			if (nptr == NULL) {
				i = -1;
				goto oomem;
			}
			ptr = nptr;
		}
		(void) strvis(ptr, str, VIS_WHITE);
		(void) fprintf(fp, "%s\n", ptr);
	}
oomem:
	h_free(ptr);
done:
	return i;
}